

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

sunrealtype arkUpperBoundH0(ARKodeMem ark_mem,sunrealtype tdist)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  ulong uVar3;
  double dVar4;
  
  p_Var1 = ark_mem->tempv1;
  p_Var2 = ark_mem->tempv2;
  N_VAbs(ark_mem->yn,p_Var2);
  (*ark_mem->efun)(ark_mem->yn,p_Var1,ark_mem->e_data);
  N_VInv(p_Var1,p_Var1);
  N_VLinearSum(0x3fb999999999999a,0x3ff0000000000000,p_Var2,p_Var1,p_Var1);
  N_VAbs(ark_mem->fn,p_Var2);
  N_VDiv(p_Var2,p_Var1,p_Var1);
  dVar4 = (double)N_VMaxNorm(p_Var1);
  uVar3 = -(ulong)(1.0 < tdist * 0.1 * dVar4);
  return (sunrealtype)(~uVar3 & (ulong)(tdist * 0.1) | (ulong)(1.0 / dVar4) & uVar3);
}

Assistant:

sunrealtype arkUpperBoundH0(ARKodeMem ark_mem, sunrealtype tdist)
{
  sunrealtype hub_inv, hub;
  N_Vector temp1, temp2;

  /* Bound based on |y0|/|y0'| -- allow at most an increase of
   * H0_UBFACTOR in y0 (based on a forward Euler step). The weight
   * factor is used as a safeguard against zero components in y0. */
  temp1 = ark_mem->tempv1;
  temp2 = ark_mem->tempv2;

  N_VAbs(ark_mem->yn, temp2);
  ark_mem->efun(ark_mem->yn, temp1, ark_mem->e_data);
  N_VInv(temp1, temp1);
  N_VLinearSum(H0_UBFACTOR, temp2, ONE, temp1, temp1);

  N_VAbs(ark_mem->fn, temp2);

  N_VDiv(temp2, temp1, temp1);
  hub_inv = N_VMaxNorm(temp1);

  /* bound based on tdist -- allow at most a step of magnitude
   * H0_UBFACTOR * tdist */
  hub = H0_UBFACTOR * tdist;

  /* Use the smaller of the two */
  if (hub * hub_inv > ONE) { hub = ONE / hub_inv; }

  return (hub);
}